

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O2

Slice __thiscall arangodb::velocypack::ObjectIterator::value(ObjectIterator *this)

{
  uint8_t *puVar1;
  ValueLength VVar2;
  Slice SVar3;
  Exception *this_00;
  Slice key;
  
  if (this->_position == this->_size) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,IndexOutOfBounds);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  puVar1 = this->_current;
  if (puVar1 != (uint8_t *)0x0) {
    key._start = puVar1;
    VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&key);
    return (Slice)(puVar1 + VVar2);
  }
  SVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthValue
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     this->_position);
  return (Slice)SVar3._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }